

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O1

int file_sort(FINFO **fpp,size_t n,_func_int_void_ptr_void_ptr *sortfn)

{
  finfo *pfVar1;
  int iVar2;
  long *__base;
  int *piVar3;
  long *plVar4;
  long *plVar5;
  
  pfVar1 = *fpp;
  __base = (long *)malloc(n * 8);
  plVar4 = __base;
  if (__base == (long *)0x0) {
    piVar3 = __errno_location();
    *Lisp_errno = *piVar3;
    __base = (long *)0x0;
  }
  else {
    for (; pfVar1 != (FINFO *)0x0; pfVar1 = pfVar1->next) {
      *plVar4 = (long)pfVar1;
      plVar4 = plVar4 + 1;
    }
  }
  if (__base == (long *)0x0) {
    iVar2 = 0;
  }
  else {
    qsort(__base,n,8,(__compar_fn_t)sortfn);
    plVar4 = __base;
    plVar5 = __base;
    if (1 < n) {
      do {
        plVar4 = plVar5 + 1;
        *(long *)(*plVar5 + 0x220) = plVar5[1];
        n = n - 1;
        plVar5 = plVar4;
      } while (1 < n);
    }
    *(undefined8 *)(*plVar4 + 0x220) = 0;
    *fpp = (FINFO *)*__base;
    free(__base);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int file_sort(FINFO **fpp, size_t n, int (*sortfn)(const void *, const void *))
{
  FINFO **fp;
  FINFO **sort_bufp;

  if ((sort_bufp = prepare_sort_buf(*fpp, n)) == (FINFO **)NULL) return (0);

  qsort(sort_bufp, n, sizeof(FINFO *), sortfn);

  /*
   * Relink FINFO structures in a buffer.
   */
  for (fp = sort_bufp; n > 1; fp++, n--) (*fp)->next = *(fp + 1);
  (*fp)->next = (FINFO *)NULL;

  *fpp = *sort_bufp;

  free((char *)sort_bufp);

  return (1);
}